

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *__s;
  FILE *__stream;
  object *poVar3;
  long lVar4;
  object *local_100;
  object *local_f8;
  object *local_f0;
  object *local_e8;
  int local_e0;
  int local_dc;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  char *p;
  char imageFileName [120];
  FILE *fp;
  int dynamicSize;
  int staticSize;
  int i;
  int size;
  object *o;
  object *aContext;
  object *aProcess;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  aProcess = (object *)argv;
  argv_local._0_4_ = argc;
  printf("Little Smalltalk starting up...\n");
  prog_argc = (int)argv_local;
  prog_argv = (char **)aProcess;
  strcpy((char *)&p,"lst.img");
  fp._4_4_ = 300000;
  fp._0_4_ = 300000;
  tmpdir = "/tmp";
  __s = getenv("TMPDIR");
  if (__s != (char *)0x0) {
    tmpdir = strdup(__s);
  }
  for (dynamicSize = 1; dynamicSize < (int)argv_local; dynamicSize = dynamicSize + 1) {
    iVar1 = strcmp((char *)(&aProcess->header)[dynamicSize],"-v");
    if (iVar1 == 0) {
      printf("Little Smalltalk, version 4.7.2\n");
    }
    else {
      iVar1 = strcmp((char *)(&aProcess->header)[dynamicSize],"-s");
      if (iVar1 == 0) {
        dynamicSize = dynamicSize + 1;
        fp._4_4_ = atoi((char *)(&aProcess->header)[dynamicSize]);
      }
      else {
        iVar1 = strcmp((char *)(&aProcess->header)[dynamicSize],"-d");
        if (iVar1 == 0) {
          dynamicSize = dynamicSize + 1;
          fp._0_4_ = atoi((char *)(&aProcess->header)[dynamicSize]);
        }
        else {
          iVar1 = strcmp((char *)(&aProcess->header)[dynamicSize],"-g");
          if (iVar1 == 0) {
            info_impl("main",0x55,"Turning on debugging.");
            debugging = 1;
          }
          else {
            strcpy((char *)&p,(char *)(&aProcess->header)[dynamicSize]);
          }
        }
      }
    }
  }
  info_impl("main",0x60,"Initializing GC memory pool.");
  gcinit(fp._4_4_,(int)fp);
  info_impl("main",100,"Reading in image from file %s.",&p);
  __stream = fopen((char *)&p,"rb");
  if (__stream == (FILE *)0x0) {
    error_impl("main",0x69,"cannot open image file: %s!",&p);
  }
  uVar2 = fileIn((FILE *)__stream);
  info_impl("main",0x6c,"%d objs/cells in image.",(ulong)uVar2);
  fclose(__stream);
  find_initial_method();
  addStaticRoot(&initialMethod);
  if (debugging != 0) {
    dumpMethod(initialMethod,0);
  }
  info_impl("main",0x7a,"Setting up root process.");
  memoryPointer = (object *)&memoryPointer[-3].class;
  if ((long)memoryPointer < (long)memoryBase) {
    local_e8 = gcollect(3);
  }
  else {
    *(object **)memoryPointer = (object *)0xc;
    local_e8 = memoryPointer;
  }
  aContext = local_e8;
  poVar3 = lookupGlobal("Process");
  aContext->class = poVar3;
  for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
    (&aContext[1].header)[i_3] = (uintptr_t)nilObject;
  }
  addStaticRoot(&aContext);
  info_impl("main",0x83,"Setting up root context.");
  memoryPointer = (object *)&memoryPointer[-5].class;
  if ((long)memoryPointer < (long)memoryBase) {
    local_f0 = gcollect(7);
  }
  else {
    *(object **)memoryPointer = (object *)0x1c;
    local_f0 = memoryPointer;
  }
  local_f0->class = ContextClass;
  for (i_4 = 0; i_4 < 7; i_4 = i_4 + 1) {
    (&local_f0[1].header)[i_4] = (uintptr_t)nilObject;
  }
  aContext[1].header = (uintptr_t)local_f0;
  iVar1 = (int)((long)initialMethod[2].class >> 1);
  memoryPointer = (object *)((long)&memoryPointer->header + (long)((iVar1 + 2) * -8));
  if ((long)memoryPointer < (long)memoryBase) {
    local_f8 = gcollect(iVar1);
  }
  else {
    memoryPointer->header = (ulong)(uint)(iVar1 << 2);
    local_f8 = memoryPointer;
  }
  local_f0[2].class = local_f8;
  (local_f0[2].class)->class = ArrayClass;
  for (local_dc = 0; local_dc < iVar1; local_dc = local_dc + 1) {
    (&local_f0[2].class[1].header)[local_dc] = (uintptr_t)nilObject;
  }
  local_f0[1].class = nilObject;
  memoryPointer = (object *)&memoryPointer[-0xb].class;
  if ((long)memoryPointer < (long)memoryBase) {
    local_100 = gcollect(0x13);
  }
  else {
    *(object **)memoryPointer = (object *)0x4c;
    local_100 = memoryPointer;
  }
  local_f0[2].header = (uintptr_t)local_100;
  *(object **)(local_f0[2].header + 8) = ArrayClass;
  for (local_e0 = 0; local_e0 < 0x13; local_e0 = local_e0 + 1) {
    *(object **)(local_f0[2].header + 0x10 + (long)local_e0 * 8) = nilObject;
  }
  local_f0[3].header = 1;
  local_f0[3].class = (object *)0x1;
  local_f0[4].header = (uintptr_t)nilObject;
  local_f0[1].header = (uintptr_t)initialMethod;
  lVar4 = (long)rootTop;
  rootTop = rootTop + 1;
  rootStack[lVar4] = aContext;
  info_impl("main",0xae,"Starting execution.");
  iVar1 = execute(aContext,0);
  switch(iVar1) {
  case 2:
    printf("User defined return\n");
    break;
  case 3:
    printf("can\'t find method in call\n");
    rootTop = rootTop + -1;
    aContext = rootStack[rootTop];
    printf("Unknown method: %s\n",aContext[2].header + 0x10);
    backTrace((object *)aContext[1].header);
    break;
  case 4:
    printf("normal return\n");
    break;
  case 5:
    printf("time out\n");
    break;
  default:
    printf("unknown return code\n");
  }
  if (0 < cache_hit + cache_miss) {
    printf("\nCache statistics:\n");
    printf("  %ld hit, %ld miss for %02.2f%% hit rate.\n",
           (double)(float)(((double)cache_hit * 100.0) / (double)(cache_hit + cache_miss)),cache_hit
           ,cache_miss);
  }
  printf("\nGC statistics:\n");
  printf("  %ld garbage collections\n",gc_count);
  if (0 < gc_count) {
    printf("  %ld total microseconds in GC for %ld microseconds per GC pass.\n",gc_total_time,
           gc_total_time / gc_count);
    printf("  %ld microseconds for longest GC pause.\n",gc_max_time);
    printf("  %ld total bytes copied for %ld bytes per GC on average.\n",gc_total_mem_copied,
           gc_total_mem_copied / gc_count);
    printf("  %ld maximum bytes copied during GC.\n",gc_mem_max_copied);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    struct object *aProcess, *aContext, *o;
    int size, i, staticSize, dynamicSize;
    FILE *fp;
    char imageFileName[120], *p;

    printf("Little Smalltalk starting up...\n");

    prog_argc = argc;
    prog_argv = (const char **)argv;

    strcpy(imageFileName, DefaultImageFile);
    staticSize = DefaultStaticSize;
    dynamicSize = DefaultDynamicSize;
    tmpdir = DefaultTmpdir;

    /*
     * See if our environment tells us what TMPDIR to use
     */
    p = getenv("TMPDIR");
    if (p) {
        tmpdir = strdup(p);
    }

    /* first parse arguments */
    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            /* FIXME - this should be generated by CMake. */
            printf("Little Smalltalk, version " VERSION_STRING "\n");
        } else if (strcmp(argv[i], "-s") == 0) {
            staticSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-d") == 0) {
            dynamicSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-g") == 0) {
            info("Turning on debugging.");
            debugging = 1;
        } else {
            strcpy(imageFileName, argv[i]);
        }
    }

# ifdef COUNTTEMPS
    tempFile = fopen("/usr/tmp/counts", "w");
# endif

    info("Initializing GC memory pool.");

    gcinit(staticSize, dynamicSize);

    info("Reading in image from file %s.", imageFileName);

    /* read in the method from the image file */
    fp = fopen(imageFileName, "rb");
    if (! fp) {
        error("cannot open image file: %s!", imageFileName);
    }

    info("%d objs/cells in image.", fileIn(fp));
    fclose(fp);

    /* find the initial method. */
    find_initial_method();
    addStaticRoot(&initialMethod);

    if(debugging) {
        /* dump startup method */
        dumpMethod(initialMethod, 0);
    }

    /* build the root process with a context, make sure it is GC-proof */

    info("Setting up root process.");

    aProcess = gcalloc(processSize);
    aProcess->class = lookupGlobal("Process");
    for(int i=0; i< processSize; i++) {
        aProcess->data[i] = nilObject;
    }
    addStaticRoot(&aProcess);

    info("Setting up root context.");

    /* context should be dynamic */
    aContext = gcalloc(contextSize);
    aContext->class = ContextClass;
    for(int i=0; i< contextSize; i++) {
        aContext->data[i] = nilObject;
    }

    /* add the context to the process. */
    aProcess->data[contextInProcess] = aContext;

    /* set up context stack */
    size = integerValue(initialMethod->data[stackSizeInMethod]);
    aContext->data[stackInContext] = gcalloc(size);
    aContext->data[stackInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[stackInContext]->data[i] = nilObject;
    }

    /* set up arguments, none. */
    aContext->data[argumentsInContext] = nilObject;

    /* set up temporary array. */
    size = 19;  /* where is this number from? */
    aContext->data[temporariesInContext] = gcalloc(size);
    aContext->data[temporariesInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[temporariesInContext]->data[i] = nilObject;
    }

    aContext->data[bytePointerInContext] = newInteger(0);
    aContext->data[stackTopInContext] = newInteger(0);
    aContext->data[previousContextInContext] = nilObject;
    aContext->data[methodInContext] = initialMethod;

    /* now go do it */
    rootStack[rootTop++] = aProcess;

#if defined(PROFILE)
    take_samples(1);
#endif

    info("Starting execution.");

    switch(execute(aProcess, 0)) {
    case 2:
        printf("User defined return\n");
        break;

    case 3:
        printf("can't find method in call\n");
        aProcess = rootStack[--rootTop];
        o = aProcess->data[resultInProcess];
        printf("Unknown method: %s\n", bytePtr(o));
        aContext = aProcess->data[contextInProcess];
        backTrace(aContext);
        break;

    case 4:
        printf("normal return\n");
        break;

    case 5:
        printf("time out\n");
        break;

    default:
        printf("unknown return code\n");
        break;
    }
#if defined(VSTA) && defined(PROFILE)
    dump_samples();
#endif

    if((cache_hit + cache_miss) > 0) {
        printf("\nCache statistics:\n");
        printf("  %" PRId64 " hit, %" PRId64 " miss for %02.2f%% hit rate.\n", cache_hit, cache_miss, (float)((float)(cache_hit)*100.0/(float)(cache_hit + cache_miss)));
    }

    printf("\nGC statistics:\n");
    printf("  %" PRId64 " garbage collections\n", gc_count);
    if(gc_count > 0) {
        printf("  %" PRId64 " total microseconds in GC for %" PRId64 " microseconds per GC pass.\n", gc_total_time, gc_total_time/gc_count);
        printf("  %" PRId64 " microseconds for longest GC pause.\n", gc_max_time);
        printf("  %" PRId64 " total bytes copied for %" PRId64 " bytes per GC on average.\n", gc_total_mem_copied, gc_total_mem_copied/gc_count);
        printf("  %" PRId64 " maximum bytes copied during GC.\n", gc_mem_max_copied);
    }

    return(0);
}